

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

FilterCoordinator * __thiscall
helics::FilterFederate::getFilterCoordinator(FilterFederate *this,InterfaceHandle handle)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_helics::FilterCoordinator_*,_false> _Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  __single_object ff;
  __uniq_ptr_impl<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
  local_20;
  InterfaceHandle local_14;
  
  p_Var1 = &(this->filterCoord)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < handle.hid]
      ) {
    if (handle.hid <= (int)p_Var4[1]._M_color) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = p_Var3, handle.hid < (int)p_Var3[1]._M_color)) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    local_14.hid = handle.hid;
    _Var2._M_head_impl = (FilterCoordinator *)operator_new(0x60);
    ((_Var2._M_head_impl)->sourceFilters).
    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((_Var2._M_head_impl)->sourceFilters).
    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var2._M_head_impl)->sourceFilters).
    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (_Var2._M_head_impl)->destFilter = (FilterInfo *)0x0;
    ((_Var2._M_head_impl)->allSourceFilters).
    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((_Var2._M_head_impl)->allSourceFilters).
    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var2._M_head_impl)->allSourceFilters).
    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((_Var2._M_head_impl)->cloningDestFilters).
    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((_Var2._M_head_impl)->cloningDestFilters).
    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var2._M_head_impl)->cloningDestFilters).
    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (_Var2._M_head_impl)->hasSourceFilters = false;
    (_Var2._M_head_impl)->hasDestFilters = false;
    *(undefined2 *)&(_Var2._M_head_impl)->field_0x52 = 0;
    (_Var2._M_head_impl)->ongoingSourceTransactions = 0;
    *(undefined8 *)&(_Var2._M_head_impl)->ongoingDestTransactions = 0;
    local_20._M_t.
    super__Tuple_impl<0UL,_helics::FilterCoordinator_*,_std::default_delete<helics::FilterCoordinator>_>
    .super__Head_base<0UL,_helics::FilterCoordinator_*,_false>._M_head_impl =
         (tuple<helics::FilterCoordinator_*,_std::default_delete<helics::FilterCoordinator>_>)
         (tuple<helics::FilterCoordinator_*,_std::default_delete<helics::FilterCoordinator>_>)
         _Var2._M_head_impl;
    std::
    _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>>>
    ::
    _M_emplace_unique<helics::InterfaceHandle&,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>
              ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>>>
                *)&this->filterCoord,&local_14,
               (unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
                *)&local_20);
    if ((_Tuple_impl<0UL,_helics::FilterCoordinator_*,_std::default_delete<helics::FilterCoordinator>_>
         )local_20._M_t.
          super__Tuple_impl<0UL,_helics::FilterCoordinator_*,_std::default_delete<helics::FilterCoordinator>_>
          .super__Head_base<0UL,_helics::FilterCoordinator_*,_false>._M_head_impl !=
        (FilterCoordinator *)0x0) {
      std::default_delete<helics::FilterCoordinator>::operator()
                ((default_delete<helics::FilterCoordinator> *)&local_20,
                 (FilterCoordinator *)
                 local_20._M_t.
                 super__Tuple_impl<0UL,_helics::FilterCoordinator_*,_std::default_delete<helics::FilterCoordinator>_>
                 .super__Head_base<0UL,_helics::FilterCoordinator_*,_false>._M_head_impl);
    }
  }
  else {
    _Var2._M_head_impl = (FilterCoordinator *)p_Var4[1]._M_parent;
  }
  return _Var2._M_head_impl;
}

Assistant:

FilterCoordinator* FilterFederate::getFilterCoordinator(InterfaceHandle handle)
{
    auto fnd = filterCoord.find(handle);
    if (fnd == filterCoord.end()) {
        // just make a dummy filterFunction so we have something to return
        auto ff = std::make_unique<FilterCoordinator>();
        auto* ffp = ff.get();
        filterCoord.emplace(handle, std::move(ff));
        return ffp;
    }
    return fnd->second.get();
}